

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcElementarySurface,_1UL>::Construct
                   (DB *db,LIST *params)

{
  IfcElementarySurface *in;
  
  in = (IfcElementarySurface *)operator_new(0x60);
  *(undefined ***)&in->field_0x48 = &PTR__Object_007e4a70;
  *(undefined8 *)&in->field_0x50 = 0;
  *(char **)&in->field_0x58 = "IfcElementarySurface";
  Assimp::IFC::Schema_2x3::IfcSurface::IfcSurface
            ((IfcSurface *)in,&PTR_construction_vtable_24__007f1fe8);
  *(undefined8 *)&(in->super_IfcSurface).field_0x38 = 0;
  *(undefined8 *)&(in->super_IfcSurface).field_0x40 = 0;
  (in->super_IfcSurface).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcElementarySurface_007f1f30;
  *(undefined ***)&in->field_0x48 = &PTR__IfcElementarySurface_007f1fd0;
  *(undefined ***)
   &(in->super_IfcSurface).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcElementarySurface_007f1f58;
  *(undefined ***)
   &(in->super_IfcSurface).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcElementarySurface_007f1f80;
  *(undefined ***)&(in->super_IfcSurface).super_IfcGeometricRepresentationItem.field_0x30 =
       &PTR__IfcElementarySurface_007f1fa8;
  GenericFill<Assimp::IFC::Schema_2x3::IfcElementarySurface>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcSurface).super_IfcGeometricRepresentationItem.
                 super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                 _vptr_ObjectHelper +
         (long)(in->super_IfcSurface).super_IfcGeometricRepresentationItem.
               super_IfcRepresentationItem.
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
               _vptr_ObjectHelper[-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }